

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

void __thiscall entityx::EntityManager::remove<Direction>(EntityManager *this,Id id)

{
  long *plVar1;
  Family __position;
  ComponentHandle<Direction,_entityx::EntityManager> component;
  Entity local_40;
  ComponentHandle<Direction,_entityx::EntityManager> local_30;
  
  __position = Component<Direction>::family();
  plVar1 = *(long **)(*(long *)(this + 0x18) + __position * 8);
  local_40.manager_ = this;
  local_40.id_.id_ = id.id_;
  local_30.manager_ = this;
  local_30.id_.id_ = id.id_;
  EventManager::
  emit<entityx::ComponentRemovedEvent<Direction>,entityx::Entity,entityx::ComponentHandle<Direction,entityx::EntityManager>&>
            (*(EventManager **)(this + 0x10),&local_40,&local_30);
  Catch::clara::std::bitset<64UL>::reset
            ((bitset<64UL> *)((id.id_ & 0xffffffff) * 8 + *(long *)(this + 0x48)),__position);
  (**(code **)(*plVar1 + 0x10))(plVar1,id.id_ & 0xffffffff);
  return;
}

Assistant:

void remove(Entity::Id id) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    const uint32_t index = id.index();

    // Find the pool for this component family.
    BasePool *pool = component_pools_[family];
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentRemovedEvent<C>>(Entity(this, id), component);

    // Remove component bit.
    entity_component_mask_[id.index()].reset(family);

    // Call destructor.
    pool->destroy(index);
  }